

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t
duckdb::TimeBucket::WidthConvertibleToMicrosCommon
          (int64_t bucket_width_micros,int64_t ts_micros,int64_t origin_micros)

{
  long lVar1;
  timestamp_t tVar2;
  long left;
  
  lVar1 = SubtractOperatorOverflowCheck::Operation<long,long,long>
                    (ts_micros,origin_micros % bucket_width_micros);
  left = lVar1 - lVar1 % bucket_width_micros;
  if (lVar1 % bucket_width_micros != 0 && lVar1 < 0) {
    left = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,bucket_width_micros);
  }
  tVar2 = Timestamp::FromEpochMicroSeconds(left + origin_micros % bucket_width_micros);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline timestamp_t WidthConvertibleToMicrosCommon(int64_t bucket_width_micros, int64_t ts_micros,
	                                                         int64_t origin_micros) {
		origin_micros %= bucket_width_micros;
		ts_micros = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(ts_micros, origin_micros);

		int64_t result_micros = (ts_micros / bucket_width_micros) * bucket_width_micros;
		if (ts_micros < 0 && ts_micros % bucket_width_micros != 0) {
			result_micros =
			    SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(result_micros, bucket_width_micros);
		}
		result_micros += origin_micros;

		return Timestamp::FromEpochMicroSeconds(result_micros);
	}